

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Matrix<double,__1,_1,_0,__1,_1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
_set_noalias<Eigen::CwiseBinaryOp<ear::ngonVertexOrder(Eigen::Matrix<double,_1,_1,0,_1,_1>)::__0,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,_1,1>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,_1,1>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
          (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this,
          DenseBase<Eigen::CwiseBinaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:67:25),_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
          *other)

{
  Matrix<double,__1,_1,_0,__1,_1> *pMVar1;
  CwiseBinaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:67:25),_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  *src;
  assign_op<double,_double> local_19;
  EigenBase<Eigen::CwiseBinaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:67:25),_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
  *local_18;
  DenseBase<Eigen::CwiseBinaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:67:25),_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
  *other_local;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_local;
  
  local_18 = (EigenBase<Eigen::CwiseBinaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:67:25),_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
              *)other;
  other_local = (DenseBase<Eigen::CwiseBinaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:67:25),_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                 *)this;
  pMVar1 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::derived
                     ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  src = EigenBase<Eigen::CwiseBinaryOp<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/src/common/geom.cpp:67:25),_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
        ::derived(local_18);
  internal::assign_op<double,_double>::assign_op(&local_19);
  internal::
  call_assignment_no_alias<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<ear::ngonVertexOrder(Eigen::Matrix<double,_1,_1,0,_1,_1>)::__0,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,_1,1>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,_1,1>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const>,Eigen::internal::assign_op<double,double>>
            (pMVar1,src,&local_19);
  pMVar1 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::derived
                     ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  return pMVar1;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }